

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O3

bool __thiscall
Symbol::IsInSlot(Symbol *this,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                bool ensureSlotAlloc)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  
  uVar1 = *(ushort *)&this->field_0x42;
  if ((uVar1 & 0x4008) == 0) {
    uVar3 = (uint)uVar1;
    if (((funcInfo->field_0xb4 & 0x10) != 0) && (uVar3 = (uint)uVar1, this->symbolType == STFormal))
    {
      bVar2 = ByteCodeGenerator::NeedScopeObjectForArguments
                        (byteCodeGenerator,funcInfo,funcInfo->root);
      if (bVar2) {
        return true;
      }
      uVar3 = (uint)*(ushort *)&this->field_0x42;
    }
    bVar2 = true;
    if (((uVar3 >> 9 & 1) == 0) && ((this->scope->field_0x44 & 8) == 0)) {
      if ((uVar3 & 0x10) != 0 && !ensureSlotAlloc) {
        bVar2 = GetIsCommittedToSlot(this);
        return bVar2;
      }
      bVar2 = SUB41((uVar3 & 0x10) >> 4,0);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Symbol::IsInSlot(ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo, bool ensureSlotAlloc)
{
    if (this->GetIsGlobal() || this->GetIsModuleExportStorage())
    {
        return false;
    }
    if (funcInfo->GetHasHeapArguments() && this->GetIsFormal() && byteCodeGenerator->NeedScopeObjectForArguments(funcInfo, funcInfo->root))
    {
        return true;
    }
    if (this->GetIsGlobalCatch())
    {
        return true;
    }
    if (this->scope->GetCapturesAll())
    {
        return true;
    }

    return this->GetHasNonLocalReference() && (ensureSlotAlloc || this->GetIsCommittedToSlot());
}